

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O2

RBTree<int> * __thiscall BinTrees::RBTree<int>::i<int_const&>(RBTree<int> *this,int *v)

{
  BinTree<int> **ppBVar1;
  BinTree<int> *pBVar2;
  runtime_error *this_00;
  BinTree<int> *pBVar3;
  BinTree<int> *x;
  BinTree<int> *x_00;
  BinTree<int> *xp;
  
  xp = (BinTree<int> *)0x0;
  ppBVar1 = BinSTree<int>::unsafe_search(&this->super_BinSTree<int>,v,&xp);
  if (*ppBVar1 != (BinTree<int> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Repeated insert.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar2 = (BinTree<int> *)operator_new(0x28);
  pBVar2->v = *v;
  pBVar2->l = (BinTree<int> *)0x0;
  pBVar2->r = (BinTree<int> *)0x0;
  pBVar2->p = xp;
  *(bool *)&pBVar2[1].v = xp != (BinTree<int> *)0x0;
  *ppBVar1 = pBVar2;
  x_00 = xp;
  do {
    if ((x_00 == (BinTree<int> *)0x0) || ((char)x_00[1].v != '\x01')) {
      this->c = false;
      return this;
    }
    x = x_00->p;
    pBVar3 = x->l;
    if (x_00 == pBVar3) {
      pBVar3 = x->r;
      if ((pBVar3 != (BinTree<int> *)0x0) && ((char)pBVar3[1].v == '\x01')) goto LAB_00102588;
      pBVar3 = x_00;
      if (pBVar2 == x_00->r) {
        this = (RBTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
        x = x_00->p->p;
        pBVar3 = x_00->p;
        pBVar2 = x_00;
      }
      *(undefined1 *)&pBVar3[1].v = 0;
      *(undefined1 *)&x[1].v = 1;
      this = (RBTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x);
    }
    else if ((pBVar3 == (BinTree<int> *)0x0) || ((char)pBVar3[1].v != '\x01')) {
      pBVar3 = x_00;
      if (pBVar2 == x_00->l) {
        this = (RBTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
        x = x_00->p->p;
        pBVar3 = x_00->p;
        pBVar2 = x_00;
      }
      *(undefined1 *)&pBVar3[1].v = 0;
      *(undefined1 *)&x[1].v = 1;
      this = (RBTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x);
    }
    else {
LAB_00102588:
      *(undefined1 *)&x_00[1].v = 0;
      *(undefined1 *)&pBVar3[1].v = 0;
      *(undefined1 *)&x[1].v = 1;
      pBVar2 = x;
    }
    x_00 = pBVar2->p;
  } while( true );
}

Assistant:

RBTree<T> *RBTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new RBTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<RBTree<T> *>(ip);
        RBTree<T> *y = nullptr;
        while (i->p() && i->p()->c) {
            if (i->p() == i->p()->p()->l()) {
                y = i->p()->p()->r();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->r()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->LR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->RR(i->p()->p()));
                }
            } else {
                y = i->p()->p()->l();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->l()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->RR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->LR(i->p()->p()));
                }
            }
        }
        root->c = false;

        return root;
    }